

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O2

void __thiscall
glcts::StateInteractionCase::generateVarLinkFragmentShaderSrc
          (StateInteractionCase *this,string *outFragSrc,GLSLVersion glslVersion,int numInputs)

{
  char *pcVar1;
  ostream *poVar2;
  uint uVar3;
  ostringstream fragSrc;
  string local_1b0 [32];
  ostream local_190;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  pcVar1 = glu::getGLSLVersionDeclaration(glslVersion);
  poVar2 = std::operator<<(&local_190,pcVar1);
  std::operator<<(poVar2,"\n");
  std::operator<<(&local_190,"precision highp float;\n");
  std::operator<<(&local_190,"precision highp int;\n");
  uVar3 = numInputs - 1;
  switch((ulong)uVar3) {
  case 4:
    std::operator<<(&local_190,"layout(location = 3) in vec4 i_val5;\n");
  case 3:
    std::operator<<(&local_190,"flat in uvec4 val4;\n");
  case 2:
    std::operator<<(&local_190,"flat in ivec2 val3;\n");
  case 1:
    std::operator<<(&local_190,"in vec3 val2[2];\n");
  case 0:
    std::operator<<(&local_190,"in vec4 val1;\n");
  default:
    std::operator<<(&local_190,"in float val0;\n");
    std::operator<<(&local_190,"layout(location = 0) out mediump vec4 o_color;\n");
    std::operator<<(&local_190,"void main (void)\n");
    std::operator<<(&local_190,"{\n");
    if (uVar3 < 5) {
      pcVar1 = &DAT_01741274 + *(int *)(&DAT_01741274 + (ulong)uVar3 * 4);
    }
    else {
      pcVar1 = "    o_color = vec4(val0, val0, val0, 1.0);\n";
    }
    std::operator<<(&local_190,pcVar1);
    std::operator<<(&local_190,"}\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)outFragSrc,local_1b0);
    std::__cxx11::string::~string(local_1b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
    return;
  }
}

Assistant:

void generateVarLinkFragmentShaderSrc(std::string& outFragSrc, glu::GLSLVersion glslVersion, int numInputs)
	{
		std::ostringstream fragSrc;

		fragSrc << glu::getGLSLVersionDeclaration(glslVersion) << "\n";
		fragSrc << "precision highp float;\n";
		fragSrc << "precision highp int;\n";

		switch (numInputs)
		{
		// Note all these cases fall through
		case 5:
			fragSrc << "layout(location = 3) in vec4 i_val5;\n";
		case 4:
			fragSrc << "flat in uvec4 val4;\n";
		case 3:
			fragSrc << "flat in ivec2 val3;\n";
		case 2:
			fragSrc << "in vec3 val2[2];\n";
		case 1:
			fragSrc << "in vec4 val1;\n";
		default:
			fragSrc << "in float val0;\n";
		}

		fragSrc << "layout(location = 0) out mediump vec4 o_color;\n";
		fragSrc << "void main (void)\n";
		fragSrc << "{\n";

		switch (numInputs)
		{
		case 5:
			fragSrc << "    o_color = i_val5;\n";
			break;
		case 4:
			fragSrc << "    o_color = vec4(val4);\n";
			break;
		case 3:
			fragSrc << "    o_color = vec4(val3, 1.0, 1.0);\n";
			break;
		case 2:
			fragSrc << "    o_color = vec4(val2[0], 1.0);\n";
			break;
		case 1:
			fragSrc << "    o_color = vec4(val1);\n";
			break;
		default:
			fragSrc << "    o_color = vec4(val0, val0, val0, 1.0);\n";
			break;
		}

		fragSrc << "}\n";

		outFragSrc = fragSrc.str();
	}